

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_UsePuzzleItem(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  AInventory *pAVar1;
  AInventory *pAVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  undefined7 in_register_00000011;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  AActor *pAVar7;
  bool bVar8;
  bool bVar9;
  FSoundID local_2c;
  
  uVar6 = CONCAT71(in_register_00000011,backSide);
  if (it != (AActor *)0x0) {
    pAVar1 = (it->Inventory).field_0.p;
    pAVar7 = it;
    pPVar3 = APuzzleItem::RegistrationInfo.MyClass;
    if ((pAVar1 != (AInventory *)0x0) &&
       (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (it->Inventory).field_0.p = (AInventory *)0x0;
      pAVar1 = (AInventory *)0x0;
      pPVar3 = APuzzleItem::RegistrationInfo.MyClass;
    }
    while (pAVar2 = pAVar1, APuzzleItem::RegistrationInfo.MyClass = pPVar3,
          pAVar2 != (AInventory *)0x0) {
      if ((pAVar2->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                          (pAVar2,pAVar7,uVar6);
        (pAVar2->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar4);
        uVar6 = extraout_RDX;
      }
      pPVar5 = (pAVar2->super_AActor).super_DThinker.super_DObject.Class;
      bVar8 = pPVar5 == (PClass *)0x0;
      bVar9 = !bVar8;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar8);
      pAVar7 = (AActor *)CONCAT71((int7)((ulong)pAVar7 >> 8),pPVar5 == pPVar3 || bVar8);
      if (pPVar5 != pPVar3 && !bVar8) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if ((bVar9) && (*(int *)&pAVar2->field_0x4fc == arg0)) {
        iVar4 = (*(it->super_DThinker).super_DObject._vptr_DObject[0x17])(it,pAVar2);
        if ((char)iVar4 != '\0') {
          return 1;
        }
        break;
      }
      pAVar1 = (pAVar2->super_AActor).Inventory.field_0.p;
      pPVar3 = APuzzleItem::RegistrationInfo.MyClass;
      if ((pAVar1 != (AInventory *)0x0) &&
         (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar2->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar1 = (AInventory *)0x0;
        pPVar3 = APuzzleItem::RegistrationInfo.MyClass;
      }
    }
    local_2c.ID = S_FindSound("*puzzfail");
    S_Sound(it,2,&local_2c,1.0,1.001);
  }
  return 0;
}

Assistant:

FUNC(LS_UsePuzzleItem)
// UsePuzzleItem (item, script)
{
	AInventory *item;

	if (!it) return false;

	// Check player's inventory for puzzle item
	for (item = it->Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf (RUNTIME_CLASS(APuzzleItem)))
		{
			if (static_cast<APuzzleItem*>(item)->PuzzleItemNumber == arg0)
			{
				if (it->UseInventory (item))
				{
					return true;
				}
				break;
			}
		}
	}

	// [RH] Say "hmm" if you don't have the puzzle item
	S_Sound (it, CHAN_VOICE, "*puzzfail", 1, ATTN_IDLE);
	return false;
}